

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void BrotliStoreUncompressedMetaBlock
               (int is_final_block,uint8_t *input,size_t position,size_t mask,size_t len,
               size_t *storage_ix,uint8_t *storage)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  size_t nlenbits;
  uint64_t lenbits;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar5 = *storage_ix;
  *(ulong *)(storage + (uVar5 >> 3)) = (ulong)storage[uVar5 >> 3];
  uVar2 = uVar5 + 1;
  *storage_ix = uVar2;
  BrotliEncodeMlen(len,&local_40,&local_48,&local_38);
  if ((local_38 < 4) &&
     (*(ulong *)(storage + (uVar2 >> 3)) =
           local_38 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3],
     local_40 >> ((byte)local_48 & 0x3f) == 0)) {
    if (0x38 < local_48) {
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x37,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    uVar4 = position & mask;
    uVar5 = uVar5 + 3;
    *(ulong *)(storage + (uVar5 >> 3)) = local_40 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
    local_48 = local_48 + uVar5;
    *(ulong *)(storage + (local_48 >> 3)) =
         (ulong)storage[local_48 >> 3] | 1L << ((byte)local_48 & 7);
    uVar3 = (int)local_48 + 8;
    uVar2 = (ulong)(uVar3 & 0xfffffff8);
    uVar5 = (ulong)(uVar3 >> 3);
    storage[uVar5] = '\0';
    if (mask + 1 < uVar4 + len) {
      __n = (mask + 1) - uVar4;
      memcpy(storage + uVar5,input + uVar4,__n);
      uVar2 = uVar2 + __n * 8;
      len = len - __n;
      uVar5 = uVar2 >> 3;
      uVar4 = 0;
    }
    memcpy(storage + uVar5,input + uVar4,len);
    uVar2 = uVar2 + len * 8;
    *storage_ix = uVar2;
    storage[uVar2 >> 3] = '\0';
    if (is_final_block != 0) {
      puVar1 = storage + (uVar2 >> 3);
      puVar1[0] = '\x03';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      *storage_ix = (ulong)((int)uVar2 + 8);
      storage[(int)uVar2 + 9U >> 3] = '\0';
    }
    return;
  }
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,0x36,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
  ;
}

Assistant:

void BrotliStoreUncompressedMetaBlock(BROTLI_BOOL is_final_block,
                                      const uint8_t * BROTLI_RESTRICT input,
                                      size_t position, size_t mask,
                                      size_t len,
                                      size_t * BROTLI_RESTRICT storage_ix,
                                      uint8_t * BROTLI_RESTRICT storage) {
  size_t masked_pos = position & mask;
  BrotliStoreUncompressedMetaBlockHeader(len, storage_ix, storage);
  JumpToByteBoundary(storage_ix, storage);

  if (masked_pos + len > mask + 1) {
    size_t len1 = mask + 1 - masked_pos;
    memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len1);
    *storage_ix += len1 << 3;
    len -= len1;
    masked_pos = 0;
  }
  memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len);
  *storage_ix += len << 3;

  /* We need to clear the next 4 bytes to continue to be
     compatible with BrotliWriteBits. */
  BrotliWriteBitsPrepareStorage(*storage_ix, storage);

  /* Since the uncompressed block itself may not be the final block, add an
     empty one after this. */
  if (is_final_block) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    JumpToByteBoundary(storage_ix, storage);
  }
}